

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
           *this,size_t i,ctrl_t h)

{
  if (i < this->capacity_) {
    this->ctrl_[i] = h;
    this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (i - 0x10 & this->capacity_)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x9cd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>, phmap::Hash<char32_t>, phmap::EqualTo<char32_t>, std::allocator<char32_t>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashSetPolicy<char32_t>, Hash = phmap::Hash<char32_t>, Eq = phmap::EqualTo<char32_t>, Alloc = std::allocator<char32_t>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h)
			{
				assert(i < capacity_);

				if (IsFull(h)) {
					SanitizerUnpoisonObject(slots_ + i);
				}
				else {
					SanitizerPoisonObject(slots_ + i);
				}

				ctrl_[i] = h;
				ctrl_[((i - Group::kWidth) & capacity_) + 1 +
				                           ((Group::kWidth - 1) & capacity_)] = h;
			}